

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadStringConstant
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function,LPCWSTR *string,
          uint32 *len)

{
  uint32 uVar1;
  LPCWSTR pWVar2;
  int local_34;
  uint32 *puStack_30;
  int stringId;
  uint32 *len_local;
  LPCWSTR *string_local;
  FunctionBody *function_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  puStack_30 = len;
  len_local = (uint32 *)string;
  string_local = (LPCWSTR *)function;
  function_local = (FunctionBody *)current;
  current_local = (byte *)this;
  function_local = (FunctionBody *)ReadInt32(this,current,&local_34);
  pWVar2 = GetString16ById(this,local_34,(bool *)0x0);
  *(LPCWSTR *)len_local = pWVar2;
  uVar1 = GetString16LengthById(this,local_34);
  *puStack_30 = uVar1;
  return (byte *)function_local;
}

Assistant:

const byte* ReadStringConstant(const byte* current, FunctionBody* function, _Out_ LPCWSTR * string, _Out_ uint32 * len)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartStringConstant);
#endif
        int stringId;
        current = ReadInt32(current, &stringId);
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndStringConstant);
#endif
        *string = GetString16ById(stringId);
        *len = GetString16LengthById(stringId);

        return current;
    }